

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void NULLCIO::ReadIntFromConsole(int *val)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char buf [128];
  char local_99 [129];
  
  if (val == (int *)0x0) {
    pcVar2 = "ERROR: argument should not be a nullptr";
  }
  else {
    if (readFunc != (code *)0x0) {
      lVar3 = 0;
      local_99[1] = 0;
      local_99[0] = '\0';
      while( true ) {
        iVar1 = (*readFunc)(contextFunc,local_99,1);
        if ((iVar1 == 0) || (local_99[0] == '\n')) break;
        local_99[lVar3 + 1] = local_99[0];
        lVar3 = lVar3 + 1;
        if (lVar3 == 0x7f) {
          pcVar2 = local_99 + 0x80;
LAB_00125a2c:
          *pcVar2 = '\0';
          iVar1 = __isoc99_sscanf(local_99 + 1,"%d",val);
          if (iVar1 != 1) {
            nullcThrowError("ERROR: failed to read an int");
          }
          return;
        }
      }
      pcVar2 = local_99 + lVar3 + 1;
      goto LAB_00125a2c;
    }
    pcVar2 = "ERROR: read stream is not avaiable";
  }
  nullcThrowError(pcVar2);
  return;
}

Assistant:

void ReadIntFromConsole(int* val)
	{
		if(!val)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return;
		}

		if(!readFunc)
		{
			nullcThrowError("ERROR: read stream is not avaiable");
			return;
		}

		char buf[128];
		ReadString(buf, 128);

		int result = sscanf(buf, "%d", val);

		if(result != 1)
		{
			nullcThrowError("ERROR: failed to read an int");
			return;
		}
	}